

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::PushLoopBlockBarrier(cmMakefile *this)

{
  value_type local_14;
  cmMakefile *local_10;
  cmMakefile *this_local;
  
  local_14 = 0;
  local_10 = this;
  std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push(&this->LoopBlockCounter,&local_14);
  return;
}

Assistant:

void cmMakefile::PushLoopBlockBarrier()
{
  this->LoopBlockCounter.push(0);
}